

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

void __thiscall Fl_Table::rows(Fl_Table *this,int val)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = this->_rows;
  this->_rows = val;
  uVar2 = (this->_rowheights)._size;
  lVar5 = (long)(int)uVar2;
  if (lVar5 == 0) {
    iVar4 = 0x19;
  }
  else {
    iVar4 = (this->_rowheights).arr[uVar2 - 1];
  }
  if (uVar2 != val) {
    piVar3 = (int *)realloc((this->_rowheights).arr,(ulong)(uint)val << 2);
    (this->_rowheights).arr = piVar3;
    (this->_rowheights)._size = val;
  }
  if ((int)uVar2 < val) {
    piVar3 = (this->_rowheights).arr;
    do {
      piVar3[lVar5] = iVar4;
      lVar5 = lVar5 + 1;
    } while (val != lVar5);
  }
  table_resized(this);
  if ((iVar1 <= val) && (this->botrow < iVar1)) {
    return;
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Table::rows(int val) {
  int oldrows = _rows;
  _rows = val;
  {
    int default_h = ( _rowheights.size() > 0 ) ? _rowheights.back() : 25;
    int now_size = _rowheights.size();
    _rowheights.size(val);			// enlarge or shrink as needed
    while ( now_size < val ) {
      _rowheights[now_size++] = default_h;	// fill new
    }
  }
  table_resized();
  
  // OPTIMIZATION: redraw only if change is visible.
  if ( val >= oldrows && oldrows > botrow ) {
    // NO REDRAW
  } else {
    redraw();
  }
}